

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprNodeTest_OR(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  long in_RSI;
  int cmp;
  Fts5ExprNode *pChild;
  int i;
  Fts5ExprNode *pNext;
  Fts5ExprNode *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Fts5Expr *pExpr_00;
  int local_1c;
  Fts5Expr *local_18;
  
  local_18 = *(Fts5Expr **)(in_RSI + 0x30);
  for (local_1c = 1; local_1c < *(int *)(in_RSI + 0x28); local_1c = local_1c + 1) {
    pExpr_00 = *(Fts5Expr **)(in_RSI + 0x30 + (long)local_1c * 8);
    in_stack_ffffffffffffffd4 =
         fts5NodeCompare(pExpr_00,(Fts5ExprNode *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8);
    if ((0 < in_stack_ffffffffffffffd4) ||
       ((in_stack_ffffffffffffffd4 == 0 && (*(int *)&pExpr_00->pConfig == 0)))) {
      local_18 = pExpr_00;
    }
  }
  *(undefined8 *)(in_RSI + 0x18) = *(undefined8 *)&local_18->bDesc;
  *(undefined4 *)(in_RSI + 4) = *(undefined4 *)((long)&local_18->pIndex + 4);
  *(undefined4 *)(in_RSI + 8) = *(undefined4 *)&local_18->pConfig;
  return;
}

Assistant:

static void fts5ExprNodeTest_OR(
  Fts5Expr *pExpr,                /* Expression of which pNode is a part */
  Fts5ExprNode *pNode             /* Expression node to test */
){
  Fts5ExprNode *pNext = pNode->apChild[0];
  int i;

  for(i=1; i<pNode->nChild; i++){
    Fts5ExprNode *pChild = pNode->apChild[i];
    int cmp = fts5NodeCompare(pExpr, pNext, pChild);
    if( cmp>0 || (cmp==0 && pChild->bNomatch==0) ){
      pNext = pChild;
    }
  }
  pNode->iRowid = pNext->iRowid;
  pNode->bEof = pNext->bEof;
  pNode->bNomatch = pNext->bNomatch;
}